

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O3

int hex_decode(char *in_buf,uint in_size,void *out_buf,uint out_size)

{
  char cVar1;
  byte *pbVar2;
  int iVar3;
  uchar *out;
  uint uVar4;
  char *pcVar5;
  char *in;
  byte bVar6;
  byte bVar7;
  
  iVar3 = (int)out_buf;
  if (out_buf == (void *)0x0) {
    uVar4 = in_size >> 1;
  }
  else {
    uVar4 = 0xffffffff;
    if (in_size >> 1 <= out_size && (in_size & 1) == 0) {
      if (out_size != 0 && in_size != 0) {
        pcVar5 = in_buf + in_size;
        pbVar2 = (byte *)((ulong)out_size + (long)out_buf);
        do {
          cVar1 = *in_buf;
          if ((byte)(cVar1 - 0x30U) < 10) {
            bVar6 = cVar1 << 4;
          }
          else {
            if ((0x19 < (byte)(cVar1 + 0x9fU)) && (0x19 < (byte)(cVar1 + 0xbfU))) {
              return -1;
            }
            bVar6 = cVar1 * '\x10' + 0x90;
          }
          *(byte *)out_buf = bVar6;
          cVar1 = in_buf[1];
          bVar7 = cVar1 - 0x30;
          if (9 < bVar7) {
            if ((byte)(cVar1 + 0x9fU) < 0x1a) {
              bVar7 = cVar1 + 0xa9;
            }
            else {
              if (0x19 < (byte)(cVar1 + 0xbfU)) {
                return -1;
              }
              bVar7 = cVar1 - 0x37;
            }
          }
          *(byte *)out_buf = bVar6 | bVar7;
          in_buf = in_buf + 2;
          out_buf = (void *)((long)out_buf + 1);
        } while ((in_buf < pcVar5) && (out_buf < pbVar2));
      }
      return (int)out_buf - iVar3;
    }
  }
  return uVar4;
}

Assistant:

int
hex_decode(const char* in_buf, unsigned in_size, void* out_buf, unsigned out_size)
{
    const char* in = in_buf;
    const char* in_end = in + in_size;
    unsigned char* out = (unsigned char*) out_buf;
    unsigned char* out_end = out + out_size;

    if(out_buf == NULL)
        return in_size / 2;

    if(in_size % 2 != 0)
        return -1;
    if(out_size < in_size / 2)
        return -1;

    in = in_buf;
    in_end = in + in_size;
    out = (unsigned char*) out_buf;
    out_end = out + out_size;

    while(in < in_end  &&  out < out_end) {
        if('0' <= *in  &&  *in <= '9')
            *out = (*in - '0') << 4;
        else if('a' <= *in  &&  *in <= 'z')
            *out = (*in - 'a' + 10) << 4;
        else if('A' <= *in  &&  *in <= 'Z')
            *out = (*in - 'A' + 10) << 4;
        else
            return -1;
        in++;

        if('0' <= *in  &&  *in <= '9')
            *out |= (*in - '0');
        else if('a' <= *in  &&  *in <= 'z')
            *out |= (*in - 'a' + 10);
        else if('A' <= *in  &&  *in <= 'Z')
            *out |= (*in - 'A' + 10);
        else
            return -1;
        in++;

        out++;
    }

    return out - (const unsigned char*) out_buf;
}